

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation_p.cpp
# Opt level: O1

void QDefaultAnimationDriver::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      QBasicTimer::stop((QBasicTimer *)(_o + 1));
      return;
    }
    if (_id == 0) {
      QBasicTimer::start((QBasicTimer *)(_o + 1),*(int *)&_o[1].d_ptr.d[1].q_ptr,PreciseTimer,_o);
      return;
    }
  }
  return;
}

Assistant:

void QDefaultAnimationDriver::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDefaultAnimationDriver *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->startTimer(); break;
        case 1: _t->stopTimer(); break;
        default: ;
        }
    }
    (void)_a;
}